

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_band.c
# Opt level: O2

void BandCopy(DlsMat A,DlsMat B,sunindextype copymu,sunindextype copyml)

{
  bandCopy(A->cols,B->cols,A->M,A->s_mu,B->s_mu,copymu,copyml);
  return;
}

Assistant:

void BandCopy(DlsMat A, DlsMat B, sunindextype copymu, sunindextype copyml)
{
  bandCopy(A->cols, B->cols, A->M, A->s_mu, B->s_mu, copymu, copyml);
}